

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QObject::removeEventFilter(QObject *this,QObject *obj)

{
  _func_int **pp_Var1;
  iterator this_00;
  iterator iVar2;
  QObject *pQVar3;
  QList<QPointer<QObject>_> *this_01;
  
  pp_Var1 = (this->d_ptr).d[1]._vptr_QObjectData;
  if (pp_Var1 != (_func_int **)0x0) {
    this_01 = (QList<QPointer<QObject>_> *)(pp_Var1 + 9);
    this_00 = QList<QPointer<QObject>_>::begin(this_01);
    iVar2 = QList<QPointer<QObject>_>::end(this_01);
    for (; this_00.i != iVar2.i; this_00.i = (QPointer<QObject> *)(&(this_00.i)->wp + 1)) {
      if ((((this_00.i)->wp).d == (Data *)0x0) ||
         (((((this_00.i)->wp).d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = ((this_00.i)->wp).value;
      }
      if (pQVar3 == obj) {
        QWeakPointer<QObject>::assign<QObject>(&(this_00.i)->wp,(QObject *)0x0);
        return;
      }
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }